

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O0

void secp256k1_testrand_init(char *hexseed)

{
  int iVar1;
  size_t sVar2;
  FILE *__stream;
  time_t tVar3;
  long lVar4;
  uchar *unaff_RBX;
  char *in_RDI;
  bool bVar5;
  uint64_t t;
  FILE *frand;
  unsigned_short sh;
  int pos;
  uchar seed16 [16];
  undefined1 local_4e [2];
  int local_4c;
  byte local_48 [4];
  byte local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  byte local_40;
  byte local_3f;
  byte local_3e;
  byte local_3d;
  byte local_3c;
  byte local_3b;
  byte local_3a;
  byte local_39;
  char *local_38;
  
  local_38 = in_RDI;
  memset(local_48,0,0x10);
  if ((local_38 == (char *)0x0) || (sVar2 = strlen(local_38), sVar2 == 0)) {
    __stream = fopen("/dev/urandom","rb");
    if ((__stream == (FILE *)0x0) || (sVar2 = fread(local_48,1,0x10,__stream), sVar2 != 0x10)) {
      tVar3 = time((time_t *)0x0);
      lVar4 = tVar3 * 0x539;
      fprintf(_stderr,
              "WARNING: could not read 16 bytes from /dev/urandom; falling back to insecure PRNG\n")
      ;
      local_48[0] = local_48[0] ^ (byte)lVar4;
      local_48[1] = local_48[1] ^ (byte)((ulong)lVar4 >> 8);
      local_48[2] = local_48[2] ^ (byte)((ulong)lVar4 >> 0x10);
      local_48[3] = local_48[3] ^ (byte)((ulong)lVar4 >> 0x18);
      local_44 = local_44 ^ (byte)((ulong)lVar4 >> 0x20);
      local_43 = local_43 ^ (byte)((ulong)lVar4 >> 0x28);
      local_42 = local_42 ^ (byte)((ulong)lVar4 >> 0x30);
      local_41 = local_41 ^ (byte)((ulong)lVar4 >> 0x38);
    }
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
  }
  else {
    local_4c = 0;
    while( true ) {
      bVar5 = false;
      if ((local_4c < 0x10) && (bVar5 = false, *local_38 != '\0')) {
        bVar5 = local_38[1] != '\0';
      }
      if ((!bVar5) || (iVar1 = __isoc99_sscanf(local_38,"%2hx",local_4e), iVar1 != 1)) break;
      local_48[local_4c] = local_4e[0];
      local_38 = local_38 + 2;
      local_4c = local_4c + 1;
    }
  }
  printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
         (ulong)local_48[0],(ulong)local_48[1],(ulong)local_48[2],(ulong)local_48[3],(ulong)local_44
         ,(uint)local_43,(uint)local_42,(uint)local_41,(uint)local_40,(uint)local_3f,(uint)local_3e,
         (uint)local_3d,(uint)local_3c,(uint)local_3b,(uint)local_3a,(uint)local_39);
  secp256k1_testrand_seed(unaff_RBX);
  return;
}

Assistant:

static void secp256k1_testrand_init(const char* hexseed) {
    unsigned char seed16[16] = {0};
    if (hexseed && strlen(hexseed) != 0) {
        int pos = 0;
        while (pos < 16 && hexseed[0] != 0 && hexseed[1] != 0) {
            unsigned short sh;
            if ((sscanf(hexseed, "%2hx", &sh)) == 1) {
                seed16[pos] = sh;
            } else {
                break;
            }
            hexseed += 2;
            pos++;
        }
    } else {
        FILE *frand = fopen("/dev/urandom", "rb");
        if ((frand == NULL) || fread(&seed16, 1, sizeof(seed16), frand) != sizeof(seed16)) {
            uint64_t t = time(NULL) * (uint64_t)1337;
            fprintf(stderr, "WARNING: could not read 16 bytes from /dev/urandom; falling back to insecure PRNG\n");
            seed16[0] ^= t;
            seed16[1] ^= t >> 8;
            seed16[2] ^= t >> 16;
            seed16[3] ^= t >> 24;
            seed16[4] ^= t >> 32;
            seed16[5] ^= t >> 40;
            seed16[6] ^= t >> 48;
            seed16[7] ^= t >> 56;
        }
        if (frand) {
            fclose(frand);
        }
    }

    printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n", seed16[0], seed16[1], seed16[2], seed16[3], seed16[4], seed16[5], seed16[6], seed16[7], seed16[8], seed16[9], seed16[10], seed16[11], seed16[12], seed16[13], seed16[14], seed16[15]);
    secp256k1_testrand_seed(seed16);
}